

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

StopPx * __thiscall Application::queryStopPx(StopPx *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  double local_20;
  double value;
  Application *this_local;
  
  value = (double)this;
  this_local = (Application *)__return_storage_ptr__;
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"StopPx: ");
  std::istream::operator>>(&std::cin,&local_20);
  FIX::StopPx::StopPx(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

FIX::StopPx Application::queryStopPx() {
  double value;
  std::cout << std::endl << "StopPx: ";
  std::cin >> value;
  return FIX::StopPx(value);
}